

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

void __thiscall
Imath_3_2::Matrix44<float>::Matrix44<double>(Matrix44<float> *this,Matrix44<double> *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = v->x[0][1];
  dVar2 = v->x[0][2];
  dVar3 = v->x[0][3];
  this->x[0][0] = (float)v->x[0][0];
  this->x[0][1] = (float)dVar1;
  this->x[0][2] = (float)dVar2;
  this->x[0][3] = (float)dVar3;
  dVar1 = v->x[1][1];
  dVar2 = v->x[1][2];
  dVar3 = v->x[1][3];
  this->x[1][0] = (float)v->x[1][0];
  this->x[1][1] = (float)dVar1;
  this->x[1][2] = (float)dVar2;
  this->x[1][3] = (float)dVar3;
  dVar1 = v->x[2][1];
  dVar2 = v->x[2][2];
  dVar3 = v->x[2][3];
  this->x[2][0] = (float)v->x[2][0];
  this->x[2][1] = (float)dVar1;
  this->x[2][2] = (float)dVar2;
  this->x[2][3] = (float)dVar3;
  dVar1 = v->x[3][1];
  dVar2 = v->x[3][2];
  dVar3 = v->x[3][3];
  this->x[3][0] = (float)v->x[3][0];
  this->x[3][1] = (float)dVar1;
  this->x[3][2] = (float)dVar2;
  this->x[3][3] = (float)dVar3;
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix44<T>::Matrix44 (
    const Matrix44<S>& v) IMATH_NOEXCEPT
{
    x[0][0] = T (v.x[0][0]);
    x[0][1] = T (v.x[0][1]);
    x[0][2] = T (v.x[0][2]);
    x[0][3] = T (v.x[0][3]);
    x[1][0] = T (v.x[1][0]);
    x[1][1] = T (v.x[1][1]);
    x[1][2] = T (v.x[1][2]);
    x[1][3] = T (v.x[1][3]);
    x[2][0] = T (v.x[2][0]);
    x[2][1] = T (v.x[2][1]);
    x[2][2] = T (v.x[2][2]);
    x[2][3] = T (v.x[2][3]);
    x[3][0] = T (v.x[3][0]);
    x[3][1] = T (v.x[3][1]);
    x[3][2] = T (v.x[3][2]);
    x[3][3] = T (v.x[3][3]);
}